

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_pstore::chunked_sequence<int,_2UL,_4UL,_4UL>_&> *
testing::internal::
MatcherCastImpl<const_pstore::chunked_sequence<int,_2UL,_4UL,_4UL>_&,_testing::internal::ElementsAreMatcher<std::tuple<int,_int,_int>_>_>
::Cast(Matcher<const_pstore::chunked_sequence<int,_2UL,_4UL,_4UL>_&> *__return_storage_ptr__,
      ElementsAreMatcher<std::tuple<int,_int,_int>_> *polymorphic_matcher_or_value)

{
  ElementsAreMatcher<std::tuple<int,_int,_int>_> *polymorphic_matcher_or_value_local;
  
  CastImpl<false>(__return_storage_ptr__,polymorphic_matcher_or_value);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> Cast(const M& polymorphic_matcher_or_value) {
    // M can be a polymorphic matcher, in which case we want to use
    // its conversion operator to create Matcher<T>.  Or it can be a value
    // that should be passed to the Matcher<T>'s constructor.
    //
    // We can't call Matcher<T>(polymorphic_matcher_or_value) when M is a
    // polymorphic matcher because it'll be ambiguous if T has an implicit
    // constructor from M (this usually happens when T has an implicit
    // constructor from any type).
    //
    // It won't work to unconditionally implicit_cast
    // polymorphic_matcher_or_value to Matcher<T> because it won't trigger
    // a user-defined conversion from M to T if one exists (assuming M is
    // a value).
    return CastImpl(polymorphic_matcher_or_value,
                    std::is_convertible<M, Matcher<T>>{},
                    std::is_convertible<M, T>{});
  }